

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_3.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  int iVar2;
  Date today;
  Date tomorrow;
  char local_2d;
  Date local_2c;
  Date local_20;
  
  Date::Date(&local_2c,0x7ba,6,0x1a);
  local_20.d = local_2c.d;
  local_20.y = local_2c.y;
  local_20.m = local_2c.m;
  iVar2 = 10;
  do {
    Date::increment_day(&local_20);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  poVar1 = operator<<((ostream *)&std::cout,&local_2c);
  local_2d = '\n';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_2d,1);
  poVar1 = operator<<(poVar1,&local_20);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{

	try
	{
		Date today{ 1978, 6,26 };
		Date tomorrow = today;
		tomorrow.add_day(10);
		std::cout << today
			<< '\n' << tomorrow << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}